

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnAtomicLoadExpr
          (ExprVisitorDelegate *this,AtomicLoadExpr *expr)

{
  AtomicLoadExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  (anonymous_namespace)::WatWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
            ((WatWriter *)this->writer_,(Expr *)expr);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnAtomicLoadExpr(AtomicLoadExpr* expr) {
  writer_->WriteLoadStoreExpr<AtomicLoadExpr>(expr);
  return Result::Ok;
}